

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O1

Vector3 * __thiscall AML::Vector3::operator/=(Vector3 *this,double s)

{
  double dVar1;
  
  dVar1 = (this->field_0).data[1];
  (this->field_0).data[0] = (this->field_0).data[0] / s;
  (this->field_0).data[1] = dVar1 / s;
  (this->field_0).data[2] = (this->field_0).data[2] / s;
  return this;
}

Assistant:

Vector3& Vector3::operator/=(double s)
    {
        x /= s;
        y /= s;
        z /= s;
        return *this;
    }